

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

bool __thiscall QWidgetWindow::updateSize(QWidgetWindow *this)

{
  long lVar1;
  bool bVar2;
  QRect *in_RDI;
  long in_FS_OFFSET;
  bool changed;
  QSize *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  WidgetAttribute in_stack_ffffffffffffff94;
  QWidget *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa8;
  byte bVar3;
  bool local_41;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = 0;
  QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b77a3);
  bVar2 = QWidget::testAttribute(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  if (bVar2) {
    local_41 = (bool)(bVar3 & 1);
  }
  else {
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b77d3);
    bVar2 = QWidget::testAttribute(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    if (bVar2) {
      local_41 = (bool)(bVar3 & 1);
    }
    else {
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b7803);
      QRect::size(in_RDI);
      QWindow::geometry();
      QRect::size(in_RDI);
      bVar2 = ::operator!=((QSize *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
      if (bVar2) {
        bVar3 = 1;
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x3b7860);
        QWindow::geometry();
        QRect::size(in_RDI);
        QRect::setSize((QRect *)CONCAT17(bVar3,in_stack_ffffffffffffffa8),(QSize *)in_RDI);
      }
      updateMargins((QWidgetWindow *)CONCAT17(bVar3,in_stack_ffffffffffffffa8));
      local_41 = (bool)(bVar3 & 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_41;
}

Assistant:

bool QWidgetWindow::updateSize()
{
    bool changed = false;
    if (m_widget->testAttribute(Qt::WA_OutsideWSRange))
        return changed;
    if (m_widget->testAttribute(Qt::WA_DontShowOnScreen))
        return changed;

    if (m_widget->data->crect.size() != geometry().size()) {
        changed = true;
        m_widget->data->crect.setSize(geometry().size());
    }

    updateMargins();
    return changed;
}